

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

bool __thiscall
caffe::BlobProto::MergePartialFromCodedStream(BlobProto *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  void *pvVar3;
  bool bVar4;
  uint32 uVar5;
  BlobShape *this_00;
  ulong extraout_RAX;
  int iVar6;
  RepeatedField<float> *pRVar7;
  RepeatedField<double> *pRVar8;
  UnknownFieldSet *unknown_fields;
  char cVar9;
  uint tag;
  ulong uVar10;
  int local_64;
  
  do {
    pbVar2 = input->buffer_;
    uVar5 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar5 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_004012a1;
      input->buffer_ = pbVar2 + 1;
      uVar10 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_004012a1:
      uVar5 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar5);
      uVar10 = 0;
      if (uVar5 - 1 < 0x7f) {
        uVar10 = 0x100000000;
      }
      uVar10 = uVar5 | uVar10;
    }
    tag = (uint)uVar10;
    if ((uVar10 & 0x100000000) == 0) goto switchD_00401326_default;
    cVar9 = (char)uVar10;
    switch((uint)(uVar10 >> 3) & 0x1fffffff) {
    case 1:
      if (cVar9 != '\b') break;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
      pbVar2 = input->buffer_;
      if (pbVar2 < input->buffer_end_) {
        bVar1 = *pbVar2;
        uVar10 = (ulong)bVar1;
        uVar5 = (uint32)bVar1;
        if ((char)bVar1 < '\0') goto LAB_004015b7;
        input->buffer_ = pbVar2 + 1;
        bVar4 = true;
      }
      else {
        uVar5 = 0;
LAB_004015b7:
        uVar10 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar5);
        bVar4 = -1 < (long)uVar10;
      }
      iVar6 = 6;
      if (bVar4) {
        this->num_ = (int32)uVar10;
        goto LAB_00401302;
      }
      goto LAB_00401304;
    case 2:
      if (cVar9 == '\x10') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
        pbVar2 = input->buffer_;
        if (pbVar2 < input->buffer_end_) {
          bVar1 = *pbVar2;
          uVar10 = (ulong)bVar1;
          uVar5 = (uint32)bVar1;
          if ((char)bVar1 < '\0') goto LAB_004015e2;
          input->buffer_ = pbVar2 + 1;
          bVar4 = true;
        }
        else {
          uVar5 = 0;
LAB_004015e2:
          uVar10 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar5);
          bVar4 = -1 < (long)uVar10;
        }
        iVar6 = 6;
        if (bVar4) {
          this->channels_ = (int32)uVar10;
          goto LAB_00401302;
        }
        goto LAB_00401304;
      }
      break;
    case 3:
      if (cVar9 == '\x18') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 8;
        pbVar2 = input->buffer_;
        if (pbVar2 < input->buffer_end_) {
          bVar1 = *pbVar2;
          uVar10 = (ulong)bVar1;
          uVar5 = (uint32)bVar1;
          if ((char)bVar1 < '\0') goto LAB_00401561;
          input->buffer_ = pbVar2 + 1;
          bVar4 = true;
        }
        else {
          uVar5 = 0;
LAB_00401561:
          uVar10 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar5);
          bVar4 = -1 < (long)uVar10;
        }
        iVar6 = 6;
        if (bVar4) {
          this->height_ = (int32)uVar10;
          goto LAB_00401302;
        }
        goto LAB_00401304;
      }
      break;
    case 4:
      if (cVar9 != ' ') break;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x10;
      pbVar2 = input->buffer_;
      if (pbVar2 < input->buffer_end_) {
        bVar1 = *pbVar2;
        uVar10 = (ulong)bVar1;
        uVar5 = (uint32)bVar1;
        if ((char)bVar1 < '\0') goto LAB_0040158c;
        input->buffer_ = pbVar2 + 1;
        bVar4 = true;
      }
      else {
        uVar5 = 0;
LAB_0040158c:
        uVar10 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar5);
        bVar4 = -1 < (long)uVar10;
      }
      iVar6 = 6;
      if (!bVar4) goto LAB_00401304;
      this->width_ = (int32)uVar10;
      goto LAB_00401302;
    case 5:
      if (cVar9 == '-') {
        uVar5 = 0x2a;
        pRVar7 = &this->data_;
LAB_0040151f:
        bVar4 = google::protobuf::internal::WireFormatLite::
                ReadRepeatedPrimitive<float,(google::protobuf::internal::WireFormatLite::FieldType)2>
                          (1,uVar5,input,pRVar7);
      }
      else {
        pRVar7 = &this->data_;
        if ((tag & 0xff) != 0x2a) break;
LAB_0040145b:
        bVar4 = google::protobuf::internal::WireFormatLite::
                ReadPackedPrimitive<float,(google::protobuf::internal::WireFormatLite::FieldType)2>
                          (input,pRVar7);
      }
      goto LAB_004012fa;
    case 6:
      if (cVar9 == '5') {
        uVar5 = 0x32;
        pRVar7 = &this->diff_;
        goto LAB_0040151f;
      }
      pRVar7 = &this->diff_;
      if ((tag & 0xff) == 0x32) goto LAB_0040145b;
      break;
    case 7:
      if (cVar9 == ':') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
        if (this->shape_ == (BlobShape *)0x0) {
          this_00 = (BlobShape *)operator_new(0x30);
          BlobShape::BlobShape(this_00);
          this->shape_ = this_00;
        }
        MergePartialFromCodedStream();
        iVar6 = local_64;
        if ((extraout_RAX & 1) == 0) goto LAB_00401302;
        goto LAB_00401304;
      }
      break;
    case 8:
      if (cVar9 != 'A') {
        pRVar8 = &this->double_data_;
        if ((tag & 0xff) == 0x42) {
LAB_004014db:
          bVar4 = google::protobuf::internal::WireFormatLite::
                  ReadPackedPrimitive<double,(google::protobuf::internal::WireFormatLite::FieldType)1>
                            (input,pRVar8);
          goto LAB_004012fa;
        }
        break;
      }
      uVar5 = 0x42;
      pRVar8 = &this->double_data_;
LAB_0040153b:
      bVar4 = google::protobuf::internal::WireFormatLite::
              ReadRepeatedPrimitive<double,(google::protobuf::internal::WireFormatLite::FieldType)1>
                        (1,uVar5,input,pRVar8);
      goto LAB_004012fa;
    case 9:
      if (cVar9 == 'I') {
        uVar5 = 0x4a;
        pRVar8 = &this->double_diff_;
        goto LAB_0040153b;
      }
      pRVar8 = &this->double_diff_;
      if ((tag & 0xff) == 0x4a) goto LAB_004014db;
    }
switchD_00401326_default:
    iVar6 = 7;
    if ((tag & 7) != 4 && tag != 0) {
      pvVar3 = (this->_internal_metadata_).
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               .ptr_;
      if (((ulong)pvVar3 & 1) == 0) {
        unknown_fields =
             google::protobuf::internal::
             InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ::mutable_unknown_fields_slow
                       (&(this->_internal_metadata_).
                         super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       );
      }
      else {
        unknown_fields = (UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe);
      }
      bVar4 = google::protobuf::internal::WireFormat::SkipField(input,tag,unknown_fields);
LAB_004012fa:
      if (bVar4 == false) {
        iVar6 = 6;
      }
      else {
LAB_00401302:
        iVar6 = 0;
      }
    }
LAB_00401304:
    if (iVar6 != 0) {
      return iVar6 != 6;
    }
  } while( true );
}

Assistant:

bool BlobProto::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:caffe.BlobProto)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional int32 num = 1 [default = 0];
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {
          set_has_num();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &num_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional int32 channels = 2 [default = 0];
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {
          set_has_channels();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &channels_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional int32 height = 3 [default = 0];
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(24u)) {
          set_has_height();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &height_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional int32 width = 4 [default = 0];
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(32u)) {
          set_has_width();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &width_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated float data = 5 [packed = true];
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(42u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, this->mutable_data())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(45u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 1, 42u, input, this->mutable_data())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated float diff = 6 [packed = true];
      case 6: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(50u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, this->mutable_diff())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(53u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 1, 50u, input, this->mutable_diff())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.BlobShape shape = 7;
      case 7: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(58u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_shape()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated double double_data = 8 [packed = true];
      case 8: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(66u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 input, this->mutable_double_data())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(65u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 1, 66u, input, this->mutable_double_data())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated double double_diff = 9 [packed = true];
      case 9: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(74u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 input, this->mutable_double_diff())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(73u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 1, 74u, input, this->mutable_double_diff())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:caffe.BlobProto)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:caffe.BlobProto)
  return false;
#undef DO_
}